

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fDefaultVertexAttributeTests.cpp
# Opt level: O2

Vector<float,_3> __thiscall
deqp::gles2::Functional::(anonymous_namespace)::convertToTypeVec<float,3,float,4>
          (_anonymous_namespace_ *this,Vector<float,_4> *v)

{
  int ndx;
  long lVar1;
  ulong extraout_XMM0_Qa;
  ulong uVar2;
  float in_XMM1_Da;
  Vector<float,_3> VVar3;
  
  tcu::Vector<float,_3>::Vector((Vector<float,_3> *)this);
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    *(undefined4 *)(this + lVar1 * 4) = 0;
  }
  uVar2 = extraout_XMM0_Qa;
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    uVar2 = (ulong)(uint)v->m_data[lVar1];
    *(float *)(this + lVar1 * 4) = v->m_data[lVar1];
  }
  VVar3.m_data[2] = in_XMM1_Da;
  VVar3.m_data[0] = (float)(int)uVar2;
  VVar3.m_data[1] = (float)(int)(uVar2 >> 0x20);
  return (Vector<float,_3>)VVar3.m_data;
}

Assistant:

tcu::Vector<T1, S1> convertToTypeVec (const tcu::Vector<T2, S2>& v)
{
	tcu::Vector<T1, S1> retVal;

	for (int ndx = 0; ndx < S1; ++ndx)
		retVal[ndx] = T1(0);

	if (S1 == 4)
		retVal[3] = T1(1);

	for (int ndx = 0; ndx < de::min(S1, S2); ++ndx)
		retVal[ndx] = T1(v[ndx]);

	return retVal;
}